

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O1

TV __thiscall Nova::Grid<float,_2>::Node(Grid<float,_2> *this,T_INDEX *index)

{
  int *piVar1;
  TV TVar2;
  Vector<float,_2,_true> *data_copy_2;
  int i;
  long lVar3;
  undefined8 *in_RDI;
  float fVar4;
  Vector<float,_2,_true> data_copy_1;
  Vector<int,_2,_true> data_copy;
  
  data_copy._data._M_elems = (T_STORAGE)(T_STORAGE)*&(index->_data)._M_elems;
  lVar3 = 0;
  do {
    piVar1 = (int *)((long)data_copy._data._M_elems + lVar3);
    *piVar1 = *piVar1 + -1;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 8);
  lVar3 = 0;
  do {
    data_copy_1._data._M_elems[lVar3] = (float)data_copy._data._M_elems[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  lVar3 = 0;
  do {
    *(float *)((long)data_copy_1._data._M_elems + lVar3) =
         *(float *)((long)data_copy_1._data._M_elems + lVar3) * *(float *)(this + lVar3 + 0x18);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 8);
  *in_RDI = *(undefined8 *)(this + 8);
  lVar3 = 0;
  do {
    fVar4 = *(float *)((long)in_RDI + lVar3) + *(float *)((long)data_copy_1._data._M_elems + lVar3);
    *(float *)((long)in_RDI + lVar3) = fVar4;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 8);
  TVar2._data._M_elems[1] = 0.0;
  TVar2._data._M_elems[0] = fVar4;
  return (TV)TVar2._data._M_elems;
}

Assistant:

TV Node(const T_INDEX& index) const
    {
        return domain.min_corner+TV(index-1)*dX;
    }